

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine_p.h
# Opt level: O0

qreal * __thiscall QGridLayoutBox::q_sizes(QGridLayoutBox *this,int which)

{
  int which_local;
  QGridLayoutBox *this_local;
  QGridLayoutBox *local_8;
  
  switch(which) {
  case 0:
    local_8 = this;
    break;
  case 1:
    local_8 = (QGridLayoutBox *)&this->q_preferredSize;
    break;
  case 2:
    local_8 = (QGridLayoutBox *)&this->q_maximumSize;
    break;
  case 3:
    local_8 = (QGridLayoutBox *)&this->q_minimumDescent;
    break;
  case 4:
    local_8 = (QGridLayoutBox *)&this->q_minimumAscent;
  }
  return &local_8->q_minimumSize;
}

Assistant:

inline const qreal &q_sizes(int which) const
    {
        switch (which) {
        case Qt::MinimumSize:
            return q_minimumSize;
        case Qt::PreferredSize:
            return q_preferredSize;
        case Qt::MaximumSize:
            return q_maximumSize;
        case Qt::MinimumDescent:
            return q_minimumDescent;
        case (Qt::MinimumDescent + 1):
            return q_minimumAscent;
        default:
            Q_UNREACHABLE();
        }
    }